

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32FloatPartialPair::initSynth
          (LA32FloatPartialPair *this,PairType useMaster,bool sawtoothWaveform,Bit8u pulseWidth,
          Bit8u resonance)

{
  Bit8u resonance_local;
  Bit8u pulseWidth_local;
  bool sawtoothWaveform_local;
  PairType useMaster_local;
  LA32FloatPartialPair *this_local;
  
  if (useMaster == MASTER) {
    LA32FloatWaveGenerator::initSynth(&this->master,sawtoothWaveform,pulseWidth,resonance);
  }
  else {
    LA32FloatWaveGenerator::initSynth(&this->slave,sawtoothWaveform,pulseWidth,resonance);
  }
  return;
}

Assistant:

void LA32FloatPartialPair::initSynth(const PairType useMaster, const bool sawtoothWaveform, const Bit8u pulseWidth, const Bit8u resonance) {
	if (useMaster == MASTER) {
		master.initSynth(sawtoothWaveform, pulseWidth, resonance);
	} else {
		slave.initSynth(sawtoothWaveform, pulseWidth, resonance);
	}
}